

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O0

void google::protobuf::CEscapeAndAppend(StringPiece src,string *dest)

{
  StringPiece src_00;
  byte bVar1;
  uint uVar2;
  size_t sVar3;
  size_t sVar4;
  char *pcVar5;
  long lVar6;
  stringpiece_ssize_type sVar7;
  char *in_RDX;
  uchar c;
  int i;
  char *append_ptr;
  size_t cur_dest_len;
  size_t escaped_len;
  char *in_stack_ffffffffffffff98;
  stringpiece_ssize_type in_stack_ffffffffffffffa0;
  int local_44;
  byte *local_40;
  StringPiece local_10;
  
  src_00.length_ = in_stack_ffffffffffffffa0;
  src_00.ptr_ = in_stack_ffffffffffffff98;
  sVar3 = CEscapedLength(src_00);
  sVar4 = StringPiece::size(&local_10);
  if (sVar3 == sVar4) {
    pcVar5 = StringPiece::data(&local_10);
    StringPiece::size(&local_10);
    std::__cxx11::string::append(in_RDX,(ulong)pcVar5);
  }
  else {
    std::__cxx11::string::size();
    std::__cxx11::string::resize((ulong)in_RDX);
    local_40 = (byte *)std::__cxx11::string::operator[]((ulong)in_RDX);
    local_44 = 0;
    while( true ) {
      lVar6 = (long)local_44;
      sVar7 = StringPiece::size(&local_10);
      if (sVar7 <= lVar6) break;
      bVar1 = StringPiece::operator[](&local_10,(long)local_44);
      if (bVar1 == 9) {
        *local_40 = 0x5c;
        local_40[1] = 0x74;
        local_40 = local_40 + 2;
      }
      else if (bVar1 == 10) {
        *local_40 = 0x5c;
        local_40[1] = 0x6e;
        local_40 = local_40 + 2;
      }
      else if (bVar1 == 0xd) {
        *local_40 = 0x5c;
        local_40[1] = 0x72;
        local_40 = local_40 + 2;
      }
      else if (bVar1 == 0x22) {
        *local_40 = 0x5c;
        local_40[1] = 0x22;
        local_40 = local_40 + 2;
      }
      else if (bVar1 == 0x27) {
        *local_40 = 0x5c;
        local_40[1] = 0x27;
        local_40 = local_40 + 2;
      }
      else if (bVar1 == 0x5c) {
        *local_40 = 0x5c;
        local_40[1] = 0x5c;
        local_40 = local_40 + 2;
      }
      else {
        uVar2 = isprint((int)(char)bVar1);
        if ((uVar2 & 1) == 0) {
          *local_40 = 0x5c;
          local_40[1] = bVar1 / 0x40 + 0x30;
          local_40[2] = (char)(((ulong)bVar1 % 0x40) / 8) + 0x30;
          local_40[3] = bVar1 % 8 + 0x30;
          local_40 = local_40 + 4;
        }
        else {
          *local_40 = bVar1;
          local_40 = local_40 + 1;
        }
      }
      local_44 = local_44 + 1;
    }
  }
  return;
}

Assistant:

void CEscapeAndAppend(StringPiece src, std::string *dest) {
  size_t escaped_len = CEscapedLength(src);
  if (escaped_len == src.size()) {
    dest->append(src.data(), src.size());
    return;
  }

  size_t cur_dest_len = dest->size();
  dest->resize(cur_dest_len + escaped_len);
  char* append_ptr = &(*dest)[cur_dest_len];

  for (int i = 0; i < src.size(); ++i) {
    unsigned char c = static_cast<unsigned char>(src[i]);
    switch (c) {
      case '\n': *append_ptr++ = '\\'; *append_ptr++ = 'n'; break;
      case '\r': *append_ptr++ = '\\'; *append_ptr++ = 'r'; break;
      case '\t': *append_ptr++ = '\\'; *append_ptr++ = 't'; break;
      case '\"': *append_ptr++ = '\\'; *append_ptr++ = '\"'; break;
      case '\'': *append_ptr++ = '\\'; *append_ptr++ = '\''; break;
      case '\\': *append_ptr++ = '\\'; *append_ptr++ = '\\'; break;
      default:
        if (!isprint(c)) {
          *append_ptr++ = '\\';
          *append_ptr++ = '0' + c / 64;
          *append_ptr++ = '0' + (c % 64) / 8;
          *append_ptr++ = '0' + c % 8;
        } else {
          *append_ptr++ = c;
        }
        break;
    }
  }
}